

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::CPY_IM(CPU *this)

{
  byte bVar1;
  byte bVar2;
  
  this->cycles = 2;
  bVar1 = GetByte(this);
  bVar2 = this->Y - bVar1;
  (this->field_6).ps =
       bVar2 & 0x80 | (bVar2 == 0) * '\x02' | bVar1 <= this->Y | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CPY_IM()
{
    cycles = 2;
    uint8_t op = GetByte();
    uint8_t res = Y - op;
    C = (Y >= op);
    Z = (Y == op);
    N = (res & 0b10000000) > 0;
}